

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::Init
          (MeshEdgebreakerTraversalPredictiveEncoder *this,
          MeshEdgebreakerEncoderImplInterface *encoder)

{
  pointer piVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  CornerTable *pCVar3;
  
  (this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_ = encoder;
  iVar2 = (*encoder->_vptr_MeshEdgebreakerEncoderImplInterface[8])(encoder);
  pCVar3 = (CornerTable *)CONCAT44(extraout_var,iVar2);
  this->corner_table_ = pCVar3;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->vertex_valences_,
             (long)(int)((ulong)((long)(pCVar3->vertex_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar3->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2));
  if ((this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      iVar2 = CornerTable::Valence(this->corner_table_,(VertexIndex)(uVar4 - 1));
      piVar1 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1[uVar5] = iVar2;
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(this->vertex_valences_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2));
  }
  return true;
}

Assistant:

bool Init(MeshEdgebreakerEncoderImplInterface *encoder) {
    if (!MeshEdgebreakerTraversalEncoder::Init(encoder)) {
      return false;
    }
    corner_table_ = encoder->GetCornerTable();
    // Initialize valences of all vertices.
    vertex_valences_.resize(corner_table_->num_vertices());
    for (uint32_t i = 0; i < vertex_valences_.size(); ++i) {
      vertex_valences_[i] = corner_table_->Valence(VertexIndex(i));
    }
    return true;
  }